

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

void Cudd_ApaPowerOfTwo(int digits,DdApaNumber number,int power)

{
  int iVar1;
  int local_20;
  int index;
  int i;
  int power_local;
  DdApaNumber number_local;
  int digits_local;
  
  for (local_20 = 0; local_20 < digits; local_20 = local_20 + 1) {
    number[local_20] = 0;
  }
  iVar1 = (digits + -1) - power / 0x20;
  if (-1 < iVar1) {
    number[iVar1] = 1 << ((byte)power & 0x1f);
  }
  return;
}

Assistant:

void
Cudd_ApaPowerOfTwo(
  int  digits,
  DdApaNumber  number,
  int  power)
{
    int i;
    int index;

    for (i = 0; i < digits; i++)
        number[i] = 0;
    i = digits - 1 - power / DD_APA_BITS;
    if (i < 0) return;
    index = power & (DD_APA_BITS - 1);
    number[i] = 1 << index;

}